

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdrag.cpp
# Opt level: O0

QDrag * __thiscall QPlatformDrag::currentDrag(QPlatformDrag *this)

{
  long lVar1;
  QDrag *pQVar2;
  long in_FS_OFFSET;
  QDragManager *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QDragManager::self();
  QDragManager::object(in_stack_ffffffffffffffc8);
  pQVar2 = ::QPointer::operator_cast_to_QDrag_((QPointer<QDrag> *)0x9870ec);
  QPointer<QDrag>::~QPointer((QPointer<QDrag> *)0x9870fb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QDrag *QPlatformDrag::currentDrag() const
{
    return QDragManager::self()->object();
}